

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# par2lpc.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  ostringstream *this;
  char *pcVar5;
  long lVar6;
  bool bVar7;
  allocator local_41d;
  int num_order;
  string local_418;
  Buffer buffer;
  vector<double,_std::allocator<double>_> coefficients;
  ParcorCoefficientsToLinearPredictiveCoefficients
  parcor_coefficients_to_linear_predictive_coefficients;
  ostringstream error_message_3;
  ifstream ifs;
  byte abStack_218 [488];
  
  num_order = 0x19;
  while (iVar3 = ya_getopt_long(argc,argv,"m:h",(option *)0x0,(int *)0x0), iVar3 == 0x6d) {
    std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_3);
    bVar1 = sptk::ConvertStringToInteger((string *)&ifs,&num_order);
    bVar7 = num_order < 0;
    std::__cxx11::string::~string((string *)&ifs);
    if (!bVar1 || bVar7) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      poVar4 = std::operator<<((ostream *)&ifs,"The argument for the -m option must be a ");
      std::operator<<(poVar4,"non-negative integer");
      std::__cxx11::string::string((string *)&error_message_3,"par2lpc",(allocator *)&buffer);
      sptk::PrintErrorMessage((string *)&error_message_3,(ostringstream *)&ifs);
LAB_001027ff:
      std::__cxx11::string::~string((string *)&error_message_3);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
      return 1;
    }
  }
  if (iVar3 != -1) {
    if (iVar3 != 0x68) {
      anon_unknown.dwarf_2ade::PrintUsage((ostream *)&std::cerr);
      return 1;
    }
    anon_unknown.dwarf_2ade::PrintUsage((ostream *)&std::cout);
    return 0;
  }
  if (1 < argc - ya_optind) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    std::operator<<((ostream *)&ifs,"Too many input files");
    std::__cxx11::string::string((string *)&error_message_3,"par2lpc",(allocator *)&buffer);
    sptk::PrintErrorMessage((string *)&error_message_3,(ostringstream *)&ifs);
    goto LAB_001027ff;
  }
  if (argc == ya_optind) {
    pcVar5 = (char *)0x0;
  }
  else {
    pcVar5 = argv[ya_optind];
  }
  bVar1 = sptk::SetBinaryMode();
  this = (ostringstream *)&ifs;
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(this);
    std::operator<<((ostream *)this,"Cannot set translation mode");
    std::__cxx11::string::string((string *)&error_message_3,"par2lpc",(allocator *)&buffer);
    sptk::PrintErrorMessage((string *)&error_message_3,(ostringstream *)&ifs);
    goto LAB_001027ff;
  }
  std::ifstream::ifstream(this);
  if ((pcVar5 == (char *)0x0) ||
     (std::ifstream::open((char *)&ifs,(_Ios_Openmode)pcVar5),
     (abStack_218[*(long *)(_ifs + -0x18)] & 5) == 0)) {
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      this = (ostringstream *)&std::cin;
    }
    sptk::ParcorCoefficientsToLinearPredictiveCoefficients::
    ParcorCoefficientsToLinearPredictiveCoefficients
              (&parcor_coefficients_to_linear_predictive_coefficients,num_order);
    buffer._vptr_Buffer = (_func_int **)&PTR__Buffer_0010fca0;
    buffer.a_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    buffer.a_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    buffer.a_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    if (parcor_coefficients_to_linear_predictive_coefficients.is_valid_ == false) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_3);
      poVar4 = std::operator<<((ostream *)&error_message_3,"Failed to initialize ");
      std::operator<<(poVar4,"ParcorCoefficientsToLinearPredictiveCoefficients");
      std::__cxx11::string::string((string *)&local_418,"par2lpc",(allocator *)&coefficients);
      sptk::PrintErrorMessage(&local_418,&error_message_3);
      std::__cxx11::string::~string((string *)&local_418);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_3);
      iVar3 = 1;
    }
    else {
      lVar6 = (long)num_order;
      std::vector<double,_std::allocator<double>_>::vector
                (&coefficients,lVar6 + 1U,(allocator_type *)&error_message_3);
      do {
        iVar3 = (int)(lVar6 + 1U);
        bVar1 = sptk::ReadStream<double>(false,0,0,iVar3,&coefficients,(istream *)this,(int *)0x0);
        if (!bVar1) {
          iVar3 = 0;
          goto LAB_00102a0d;
        }
        bVar1 = sptk::ParcorCoefficientsToLinearPredictiveCoefficients::Run
                          (&parcor_coefficients_to_linear_predictive_coefficients,&coefficients,
                           &buffer);
        if (!bVar1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_3);
          poVar4 = std::operator<<((ostream *)&error_message_3,
                                   "Failed to convert PARCOR coefficients to ");
          std::operator<<(poVar4,"linear predictive coefficients");
          std::__cxx11::string::string((string *)&local_418,"par2lpc",&local_41d);
          sptk::PrintErrorMessage(&local_418,&error_message_3);
          goto LAB_001029f6;
        }
        bVar1 = sptk::WriteStream<double>(0,iVar3,&coefficients,(ostream *)&std::cout,(int *)0x0);
      } while (bVar1);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_3);
      std::operator<<((ostream *)&error_message_3,"Failed to write linear predictive coefficients");
      std::__cxx11::string::string((string *)&local_418,"par2lpc",&local_41d);
      sptk::PrintErrorMessage(&local_418,&error_message_3);
LAB_001029f6:
      std::__cxx11::string::~string((string *)&local_418);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_3);
      iVar3 = 1;
LAB_00102a0d:
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&coefficients.super__Vector_base<double,_std::allocator<double>_>);
    }
    sptk::ParcorCoefficientsToLinearPredictiveCoefficients::Buffer::~Buffer(&buffer);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_3);
    poVar4 = std::operator<<((ostream *)&error_message_3,"Cannot open file ");
    std::operator<<(poVar4,pcVar5);
    std::__cxx11::string::string((string *)&buffer,"par2lpc",(allocator *)&local_418);
    sptk::PrintErrorMessage((string *)&buffer,&error_message_3);
    std::__cxx11::string::~string((string *)&buffer);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_3);
    iVar3 = 1;
  }
  std::ifstream::~ifstream(&ifs);
  return iVar3;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "m:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("par2lpc", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("par2lpc", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("par2lpc", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("par2lpc", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::ParcorCoefficientsToLinearPredictiveCoefficients
      parcor_coefficients_to_linear_predictive_coefficients(num_order);
  sptk::ParcorCoefficientsToLinearPredictiveCoefficients::Buffer buffer;
  if (!parcor_coefficients_to_linear_predictive_coefficients.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize "
                  << "ParcorCoefficientsToLinearPredictiveCoefficients";
    sptk::PrintErrorMessage("par2lpc", error_message);
    return 1;
  }

  const int length(num_order + 1);
  std::vector<double> coefficients(length);

  while (sptk::ReadStream(false, 0, 0, length, &coefficients, &input_stream,
                          NULL)) {
    if (!parcor_coefficients_to_linear_predictive_coefficients.Run(
            &coefficients, &buffer)) {
      std::ostringstream error_message;
      error_message << "Failed to convert PARCOR coefficients to "
                    << "linear predictive coefficients";
      sptk::PrintErrorMessage("par2lpc", error_message);
      return 1;
    }

    if (!sptk::WriteStream(0, length, coefficients, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write linear predictive coefficients";
      sptk::PrintErrorMessage("par2lpc", error_message);
      return 1;
    }
  }

  return 0;
}